

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

void __thiscall clipp::parameter::parameter(parameter *this,match_predicate *filter)

{
  _Manager_type p_Var1;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  (this->super_token<clipp::parameter>).doc_._M_dataplus._M_p =
       (pointer)&(this->super_token<clipp::parameter>).doc_.field_2;
  (this->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (this->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_token<clipp::parameter>).repeatable_ = false;
  (this->super_token<clipp::parameter>).blocking_ = false;
  memset(&this->super_action_provider<clipp::parameter>,0,0x90);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  local_30 = filter->_M_invoker;
  p_Var1 = (filter->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(filter->super__Function_base)._M_functor
    ;
    local_68._8_8_ = *(undefined8 *)((long)&(filter->super__Function_base)._M_functor + 8);
    (filter->super__Function_base)._M_manager = (_Manager_type)0x0;
    filter->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var1;
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  p_Stack_50 = local_30;
  if (local_58 != (_Manager_type)0x0) {
    local_48._M_unused._M_object = local_68._M_unused._M_object;
    local_48._8_8_ = local_68._8_8_;
    local_38 = local_58;
    local_58 = (_Manager_type)0x0;
    p_Stack_50 = (_Invoker_type)0x0;
  }
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange(std::__cxx11::string_const&)> *)&this->matcher_,
             (predicate_adapter *)&local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  (this->label_)._M_dataplus._M_p = (pointer)&(this->label_).field_2;
  (this->label_)._M_string_length = 0;
  (this->label_).field_2._M_local_buf[0] = '\0';
  this->required_ = false;
  this->greedy_ = false;
  return;
}

Assistant:

explicit
    parameter(match_predicate filter):
        flags_{},
        matcher_{predicate_adapter{std::move(filter)}},
        label_{}, required_{false}, greedy_{false}
    {}